

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar3 != STATIC_LIBRARY) && (this->ImportLibrary == false)) {
    pcVar1 = this->Target->Target->Makefile;
    std::__cxx11::string::string((string *)&local_70,"APPLE",&local_71);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    if (bVar2) {
      this_00 = this->Target;
      std::__cxx11::string::string((string *)&local_50,"MACOSX_BUNDLE",&local_72);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        return;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
    }
    pcVar1 = this->Target->Target->Makefile;
    std::__cxx11::string::string((string *)&local_70,"CMAKE_STRIP",(allocator *)&local_50);
    bVar2 = cmMakefile::IsSet(pcVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar4,"if(CMAKE_INSTALL_DO_STRIP)\n");
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      poVar4 = std::operator<<(poVar4,"  execute_process(COMMAND \"");
      pcVar1 = this->Target->Target->Makefile;
      std::__cxx11::string::string((string *)&local_70,"CMAKE_STRIP",(allocator *)&local_50);
      pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_70);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\" \"");
      poVar4 = std::operator<<(poVar4,(string *)toDestDirPath);
      std::operator<<(poVar4,"\")\n");
      std::__cxx11::string::~string((string *)&local_70);
      poVar4 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
      std::operator<<(poVar4,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddStripRule(std::ostream& os, Indent indent,
                                            const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->ImportLibrary) {
    return;
  }

  // Don't handle OSX Bundles.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE") &&
      this->Target->GetPropertyAsBool("MACOSX_BUNDLE")) {
    return;
  }

  if (!this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP")) {
    return;
  }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetDefinition("CMAKE_STRIP")
     << "\" \"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}